

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void Assimp::FBX::Node::WritePropertyNodeBinary
               (string *name,vector<double,_std::allocator<double>_> *v,StreamWriterLE *s)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  reference pdVar4;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_b0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_a8;
  const_iterator it;
  undefined1 local_90 [8];
  Node node;
  StreamWriterLE *s_local;
  vector<double,_std::allocator<double>_> *v_local;
  string *name_local;
  
  node.property_start = (size_t)s;
  Node((Node *)local_90,name);
  BeginBinary((Node *)local_90,(StreamWriterLE *)node.property_start);
  StreamWriter<false,_false>::PutU1((StreamWriter<false,_false> *)node.property_start,'d');
  sVar1 = node.property_start;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(v);
  StreamWriter<false,_false>::PutU4((StreamWriter<false,_false> *)sVar1,(uint32_t)sVar3);
  StreamWriter<false,_false>::PutU4((StreamWriter<false,_false> *)node.property_start,0);
  sVar1 = node.property_start;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(v);
  StreamWriter<false,_false>::PutU4((StreamWriter<false,_false> *)sVar1,(int)sVar3 << 3);
  local_a8._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(v);
  while( true ) {
    local_b0._M_current = (double *)std::vector<double,_std::allocator<double>_>::end(v);
    bVar2 = __gnu_cxx::operator!=(&local_a8,&local_b0);
    sVar1 = node.property_start;
    if (!bVar2) break;
    pdVar4 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_a8);
    StreamWriter<false,_false>::PutF8((StreamWriter<false,_false> *)sVar1,*pdVar4);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_a8);
  }
  EndPropertiesBinary((Node *)local_90,(StreamWriterLE *)node.property_start,1);
  EndBinary((Node *)local_90,(StreamWriterLE *)node.property_start,false);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void FBX::Node::WritePropertyNodeBinary(
    const std::string& name,
    const std::vector<double>& v,
    Assimp::StreamWriterLE& s
){
    FBX::Node node(name);
    node.BeginBinary(s);
    s.PutU1('d');
    s.PutU4(uint32_t(v.size())); // number of elements
    s.PutU4(0); // no encoding (1 would be zip-compressed)
    s.PutU4(uint32_t(v.size()) * 8); // data size
    for (auto it = v.begin(); it != v.end(); ++it) { s.PutF8(*it); }
    node.EndPropertiesBinary(s, 1);
    node.EndBinary(s, false);
}